

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O0

Result __thiscall tonk::SessionOutgoing::PostRetransmit(SessionOutgoing *this,bool *messageSent)

{
  Channel *pCVar1;
  bool bVar2;
  __int_type_conflict3 _Var3;
  _func_int **pp_Var4;
  uint8_t *puVar5;
  undefined1 *in_RDX;
  SessionOutgoing *in_RSI;
  SessionOutgoing *in_RDI;
  OutgoingQueuedDatagram *datagram;
  int retransmitResult;
  SiameseOriginalPacket original;
  Locker locker;
  LogStringBuffer buffer;
  Lock *in_stack_fffffffffffffc38;
  LogStringBuffer *in_stack_fffffffffffffc40;
  SiameseEncoder in_stack_fffffffffffffc48;
  ErrorType type;
  string *in_stack_fffffffffffffc50;
  char *in_stack_fffffffffffffc58;
  ErrorResult *in_stack_fffffffffffffc60;
  LogStringBuffer *in_stack_fffffffffffffc78;
  allocator *paVar6;
  uint bytes;
  Allocator *in_stack_fffffffffffffc80;
  allocator local_319;
  string local_318 [36];
  SiameseResult local_2f4;
  int32_t local_2f0;
  uint local_2ec;
  void *local_2e8;
  SessionOutgoing *datagram_00;
  SessionOutgoing *this_00;
  undefined1 local_210 [16];
  ostream aoStack_200 [376];
  char *local_88;
  undefined4 local_7c;
  Channel *local_78;
  char *local_70;
  string *local_68;
  undefined1 *local_60;
  Channel *local_58;
  string *local_50;
  undefined1 *local_48;
  Channel *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  Channel *local_18;
  char *local_10;
  undefined1 *local_8;
  
  *in_RDX = 0;
  datagram_00 = in_RSI;
  this_00 = in_RDI;
  bVar2 = std::atomic::operator_cast_to_bool((atomic<bool> *)in_stack_fffffffffffffc48);
  if (bVar2) {
    _Var3 = std::__atomic_base::operator_cast_to_int
                      ((__atomic_base<int> *)in_stack_fffffffffffffc48);
    bytes = (uint)((ulong)in_stack_fffffffffffffc78 >> 0x20);
    if (_Var3 < 1) {
      Result::Success();
    }
    else {
      local_2f4 = siamese_encoder_retransmit
                            (in_stack_fffffffffffffc48,
                             (SiameseOriginalPacket *)in_stack_fffffffffffffc40);
      type = (ErrorType)((ulong)in_stack_fffffffffffffc48 >> 0x20);
      if (local_2f4 == Siamese_NeedMoreData) {
        Result::Success();
      }
      else if (local_2f4 == Siamese_Success) {
        Locker::Locker((Locker *)in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
        puVar5 = pktalloc::Allocator::Allocate(in_stack_fffffffffffffc80,bytes);
        Locker::~Locker((Locker *)0x1e3113);
        if (puVar5 == (uint8_t *)0x0) {
          Result::OutOfMemory();
        }
        else {
          puVar5[0] = '\0';
          puVar5[1] = '\0';
          puVar5[2] = '\0';
          puVar5[3] = '\0';
          puVar5[4] = '\0';
          puVar5[5] = '\0';
          puVar5[6] = '\0';
          puVar5[7] = '\0';
          puVar5[8] = '\0';
          puVar5[9] = '\0';
          puVar5[10] = '\0';
          puVar5[0xb] = '\0';
          puVar5[0xc] = '\0';
          puVar5[0xd] = '\0';
          puVar5[0xe] = '\0';
          puVar5[0xf] = '\0';
          memcpy(puVar5 + 0x10,local_2e8,(ulong)local_2ec);
          *(uint *)(puVar5 + 8) = local_2ec;
          getPacketNumBytes(in_RSI,local_2f0);
          sendQueuedDatagram(this_00,(OutgoingQueuedDatagram *)datagram_00,
                             (uint)((ulong)in_RDX >> 0x20),(uint)in_RDX);
          *in_RDX = 1;
          Result::Success();
        }
      }
      else {
        paVar6 = &local_319;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_318,"siamese_retransmit failed",paVar6);
        pp_Var4 = (_func_int **)operator_new(0x38);
        ErrorResult::ErrorResult
                  (in_stack_fffffffffffffc60,in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                   type,(ErrorCodeT)in_stack_fffffffffffffc40);
        (in_RDI->super_IIncomingToOutgoing)._vptr_IIncomingToOutgoing = pp_Var4;
        std::__cxx11::string::~string(local_318);
        std::allocator<char>::~allocator((allocator<char> *)&local_319);
      }
    }
  }
  else {
    pCVar1 = (in_RSI->Deps).Logger;
    if ((int)pCVar1->ChannelMinLevel < 4) {
      local_7c = 3;
      local_88 = "PostRetransmit ignored before peer address is known";
      local_78 = pCVar1;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38,Trace);
      local_68 = &pCVar1->Prefix;
      local_70 = local_88;
      local_60 = local_210;
      local_58 = pCVar1;
      local_50 = local_68;
      local_48 = local_210;
      local_40 = pCVar1;
      local_38 = local_68;
      local_30 = local_210;
      std::operator<<(aoStack_200,(string *)local_68);
      local_20 = local_60;
      local_28 = local_70;
      local_8 = local_60;
      local_10 = local_70;
      local_18 = pCVar1;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write
                ((OutputWorker *)in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1e2e65);
    }
    Result::Success();
  }
  return (Result)(ErrorResult *)in_RDI;
}

Assistant:

Result SessionOutgoing::PostRetransmit(bool& messageSent)
{
    messageSent = false;

    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostRetransmit ignored before peer address is known");
        return Result::Success();
    }

    // If there is no space left:
    if (Deps.SenderControl->GetAvailableBytes() <= 0) {
        return Result::Success();
    }

    // Get the highest priority packet to retransmit from Siamese
    SiameseOriginalPacket original;
    const int retransmitResult = siamese_encoder_retransmit(
        FECEncoder,
        &original);
    // Note: The returned data is valid until siamese_encoder_ack(),
    // which is only called from this thread.

    // If there is no data to retransmit:
    if (retransmitResult == Siamese_NeedMoreData) {
        return Result::Success();
    }

    // If the Siamese call failed:
    if (retransmitResult != Siamese_Success) {
        return Result("SessionOutgoing::PostRetransmit", "siamese_retransmit failed", ErrorType::Siamese, retransmitResult);
    }

    TONK_DEBUG_ASSERT(original.DataBytes + protocol::kMaxOverheadBytes < UDPMaxDatagramBytes);

    /*
        It is not worth trying to embed retransmits with other outgoing data.

        Arguments against:

        (1) Complexity in protocol.
        (2) Complexity in decoder to make sure the data is processed in sequence.
        (3) Complexity to avoid extra delay in delivering the data.
        (4) Often times the original datagram was already max size and cannot
            be clustered anymore.
        (5) We already clustered messages into one big datagram when first sent
            so it's unlikely that we will gain advantage from more clustering.
        (6) Retransmits are even more rare than packet loss rate, so optimizing
            the bandwidth of these rare events is not going to move the needle.
    */

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + original.DataBytes + protocol::kMaxOverheadBytes + protocol::kMaxRandomPaddingBytes);
    if (!datagram) {
        return Result::OutOfMemory();
    }

    datagram->Initialize();

#ifdef TONK_DETAILED_STATS
    datagram->Stats[Stats_RetransmitSent] += original.DataBytes;
#endif // TONK_DETAILED_STATS

    // Copy data into place
    memcpy(datagram->Data, original.Data, original.DataBytes);
    datagram->NextWriteOffset = original.DataBytes;

    // No need to shrink the queued datagram here because it's already sized for the data

    // Send datagram immediately
    sendQueuedDatagram(
        datagram,
        getPacketNumBytes(original.PacketNum),
        original.PacketNum);

    messageSent = true;

    return Result::Success();
}